

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_priority.cxx
# Opt level: O1

void __thiscall nuraft::raft_server::decay_target_priority(raft_server *this)

{
  uint uVar1;
  element_type *peVar2;
  int iVar3;
  int iVar4;
  string local_40;
  
  uVar1 = this->target_priority_;
  iVar3 = 10;
  if (10 < (int)uVar1 / 5) {
    iVar3 = (int)uVar1 / 5;
  }
  iVar4 = 1;
  if (1 < (int)(uVar1 - iVar3)) {
    iVar4 = uVar1 - iVar3;
  }
  this->target_priority_ = iVar4;
  peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar2 != (element_type *)0x0) {
    iVar3 = (**(code **)(*(long *)peVar2 + 0x38))();
    if (3 < iVar3) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                (&local_40,"[PRIORITY] decay, target %d -> %d, mine %d",(ulong)uVar1,
                 (ulong)(uint)this->target_priority_,(ulong)(uint)this->my_priority_);
      (**(code **)(*(long *)peVar2 + 0x40))
                (peVar2,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_priority.cxx"
                 ,"decay_target_priority",0xd6,&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p);
      }
    }
  }
  if (1 < (int)uVar1) {
    timer_helper::reset(&this->priority_change_timer_);
  }
  return;
}

Assistant:

void raft_server::decay_target_priority() {
    // Gap should be bigger than 10.
    int gap = std::max((int)10, target_priority_ / 5);

    // Should be bigger than 0.
    int32 prev_priority = target_priority_;
    target_priority_ = std::max(1, target_priority_ - gap);
    p_in("[PRIORITY] decay, target %d -> %d, mine %d",
         prev_priority, target_priority_, my_priority_);

    // Once `target_priority_` becomes 1,
    // `priority_change_timer_` starts ticking.
    if (prev_priority > 1) priority_change_timer_.reset();
}